

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

void Gia_ManCorrReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Obj_t *pObj_00;
  
  iVar1 = Gia_ObjId(p,pObj);
  pObj_00 = Gia_ObjReprObj(p,iVar1);
  if (pObj_00 == (Gia_Obj_t *)0x0) {
    if (pObj->Value != 0xffffffff) {
      return;
    }
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                    ,0x2a1,"void Gia_ManCorrReduce_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManCorrReduce_rec(pNew,p,pObj + -(ulong)uVar2);
    Gia_ManCorrReduce_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iVar1 = Gia_ObjFanin0Copy(pObj);
    iLit1 = Abc_LitNotCond(pObj[-(*(ulong *)pObj >> 0x20 & 0x1fffffff)].Value,
                           (uint)(*(ulong *)pObj >> 0x3d) & 1);
    uVar2 = Gia_ManHashAnd(pNew,iVar1,iLit1);
  }
  else {
    Gia_ManCorrReduce_rec(pNew,p,pObj_00);
    uVar2 = Abc_LitNotCond(pObj_00->Value,
                           ((uint)pObj_00 ^ (uint)pObj) & 1 ^
                           (uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f)
                           ^ (uint)((ulong)*(undefined8 *)((ulong)pObj_00 & 0xfffffffffffffffe) >>
                                   0x3f));
  }
  pObj->Value = uVar2;
  return;
}

Assistant:

void Gia_ManCorrReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Gia_ManCorrReduce_rec( pNew, p, pRepr );
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManCorrReduce_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManCorrReduce_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}